

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_util_lite.cc
# Opt level: O0

void google::protobuf::TestUtilLite::SetPackedExtensions(TestPackedExtensionsLite *message)

{
  TestPackedExtensionsLite *message_local;
  
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                      *)&proto2_unittest::packed_int32_extension_lite,0x259);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                      *)proto2_unittest::packed_int64_extension_lite,0x25a);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                      *)&proto2_unittest::packed_uint32_extension_lite,0x25b);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                      *)proto2_unittest::packed_uint64_extension_lite,0x25c);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                      *)&proto2_unittest::packed_sint32_extension_lite,0x25d);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                      *)proto2_unittest::packed_sint64_extension_lite,0x25e);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                      *)&proto2_unittest::packed_fixed32_extension_lite,0x25f);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                      *)proto2_unittest::packed_fixed64_extension_lite,0x260);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                      *)&proto2_unittest::packed_sfixed32_extension_lite,0x261);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                      *)proto2_unittest::packed_sfixed64_extension_lite,0x262);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                      *)&proto2_unittest::packed_float_extension_lite,611.0);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                      *)proto2_unittest::packed_double_extension_lite,612.0);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                      *)&proto2_unittest::packed_bool_extension_lite,true);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,(unsigned_char)14,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true>
                      *)&proto2_unittest::packed_enum_extension_lite,FOREIGN_LITE_BAR);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)5,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_true>
                      *)&proto2_unittest::packed_int32_extension_lite,0x2bd);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)3,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x03_,_true>
                      *)proto2_unittest::packed_int64_extension_lite,0x2be);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)13,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__r_,_true>
                      *)&proto2_unittest::packed_uint32_extension_lite,0x2bf);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)4,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x04_,_true>
                      *)proto2_unittest::packed_uint64_extension_lite,0x2c0);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)17,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x11_,_true>
                      *)&proto2_unittest::packed_sint32_extension_lite,0x2c1);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)18,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x12_,_true>
                      *)proto2_unittest::packed_sint64_extension_lite,0x2c2);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,(unsigned_char)7,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_int>,_(unsigned_char)__a_,_true>
                      *)&proto2_unittest::packed_fixed32_extension_lite,0x2c3);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,(unsigned_char)6,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<unsigned_long>,_(unsigned_char)__x06_,_true>
                      *)proto2_unittest::packed_fixed64_extension_lite,0x2c4);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,(unsigned_char)15,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<int>,_(unsigned_char)__x0f_,_true>
                      *)&proto2_unittest::packed_sfixed32_extension_lite,0x2c5);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,(unsigned_char)16,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<long>,_(unsigned_char)__x10_,_true>
                      *)proto2_unittest::packed_sfixed64_extension_lite,0x2c6);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,(unsigned_char)2,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<float>,_(unsigned_char)__x02_,_true>
                      *)&proto2_unittest::packed_float_extension_lite,711.0);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,(unsigned_char)1,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<double>,_(unsigned_char)__x01_,_true>
                      *)proto2_unittest::packed_double_extension_lite,712.0);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,(unsigned_char)8,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedPrimitiveTypeTraits<bool>,_(unsigned_char)__b_,_true>
                      *)&proto2_unittest::packed_bool_extension_lite,false);
  proto2_unittest::TestPackedExtensionsLite::
  AddExtension<google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,(unsigned_char)14,true>
            (message,(ExtensionIdentifier<proto2_unittest::TestPackedExtensionsLite,_google::protobuf::internal::RepeatedEnumTypeTraits<proto2_unittest::ForeignEnumLite>,_(unsigned_char)__x0e_,_true>
                      *)&proto2_unittest::packed_enum_extension_lite,FOREIGN_LITE_BAZ);
  return;
}

Assistant:

void TestUtilLite::SetPackedExtensions(
    unittest::TestPackedExtensionsLite* message) {
  message->AddExtension(unittest::packed_int32_extension_lite, 601);
  message->AddExtension(unittest::packed_int64_extension_lite, 602);
  message->AddExtension(unittest::packed_uint32_extension_lite, 603);
  message->AddExtension(unittest::packed_uint64_extension_lite, 604);
  message->AddExtension(unittest::packed_sint32_extension_lite, 605);
  message->AddExtension(unittest::packed_sint64_extension_lite, 606);
  message->AddExtension(unittest::packed_fixed32_extension_lite, 607);
  message->AddExtension(unittest::packed_fixed64_extension_lite, 608);
  message->AddExtension(unittest::packed_sfixed32_extension_lite, 609);
  message->AddExtension(unittest::packed_sfixed64_extension_lite, 610);
  message->AddExtension(unittest::packed_float_extension_lite, 611);
  message->AddExtension(unittest::packed_double_extension_lite, 612);
  message->AddExtension(unittest::packed_bool_extension_lite, true);
  message->AddExtension(unittest::packed_enum_extension_lite,
                        unittest::FOREIGN_LITE_BAR);
  // add a second one of each field
  message->AddExtension(unittest::packed_int32_extension_lite, 701);
  message->AddExtension(unittest::packed_int64_extension_lite, 702);
  message->AddExtension(unittest::packed_uint32_extension_lite, 703);
  message->AddExtension(unittest::packed_uint64_extension_lite, 704);
  message->AddExtension(unittest::packed_sint32_extension_lite, 705);
  message->AddExtension(unittest::packed_sint64_extension_lite, 706);
  message->AddExtension(unittest::packed_fixed32_extension_lite, 707);
  message->AddExtension(unittest::packed_fixed64_extension_lite, 708);
  message->AddExtension(unittest::packed_sfixed32_extension_lite, 709);
  message->AddExtension(unittest::packed_sfixed64_extension_lite, 710);
  message->AddExtension(unittest::packed_float_extension_lite, 711);
  message->AddExtension(unittest::packed_double_extension_lite, 712);
  message->AddExtension(unittest::packed_bool_extension_lite, false);
  message->AddExtension(unittest::packed_enum_extension_lite,
                        unittest::FOREIGN_LITE_BAZ);
}